

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_fileio.cpp
# Opt level: O0

Result_t *
Kumu::ReadFileIntoBuffer
          (Result_t *__return_storage_ptr__,string *Filename,ByteString *Buffer,ui32_t param_3)

{
  bool bVar1;
  int iVar2;
  fsize_t fVar3;
  byte_t *buf;
  Result_t local_1a0;
  Result_t local_138;
  undefined1 local_d0 [8];
  FileReader Reader;
  ui32_t read_count;
  undefined1 local_90 [8];
  Result_t result;
  ui32_t file_size;
  ui32_t param_2_local;
  ByteString *Buffer_local;
  string *Filename_local;
  
  result.message.field_2._12_4_ = param_3;
  fVar3 = FileSize(Filename);
  result.message.field_2._8_4_ = (undefined4)fVar3;
  ByteString::Capacity((Result_t *)local_90,Buffer,result.message.field_2._8_4_);
  iVar2 = Result_t::operator_cast_to_int((Result_t *)local_90);
  if (-1 < iVar2) {
    Reader.m_Handle = 0;
    FileReader::FileReader((FileReader *)local_d0);
    FileReader::OpenRead(&local_138,(FileReader *)local_d0,Filename);
    Result_t::operator=((Result_t *)local_90,&local_138);
    Result_t::~Result_t(&local_138);
    iVar2 = Result_t::operator_cast_to_int((Result_t *)local_90);
    if (-1 < iVar2) {
      buf = ByteString::Data(Buffer);
      FileReader::Read(&local_1a0,(FileReader *)local_d0,buf,result.message.field_2._8_4_,
                       (ui32_t *)&Reader.m_Handle);
      Result_t::operator=((Result_t *)local_90,&local_1a0);
      Result_t::~Result_t(&local_1a0);
    }
    iVar2 = Result_t::operator_cast_to_int((Result_t *)local_90);
    if (iVar2 < 0) {
LAB_0012746d:
      bVar1 = false;
    }
    else {
      if (result.message.field_2._8_4_ == Reader.m_Handle) {
        ByteString::Length(Buffer,Reader.m_Handle);
        goto LAB_0012746d;
      }
      Result_t::Result_t(__return_storage_ptr__,(Result_t *)RESULT_READFAIL);
      bVar1 = true;
    }
    FileReader::~FileReader((FileReader *)local_d0);
    if (bVar1) goto LAB_001274be;
  }
  Result_t::Result_t(__return_storage_ptr__,(Result_t *)local_90);
LAB_001274be:
  Result_t::~Result_t((Result_t *)local_90);
  return __return_storage_ptr__;
}

Assistant:

Result_t
Kumu::ReadFileIntoBuffer(const std::string& Filename, Kumu::ByteString& Buffer, ui32_t)
{
  ui32_t file_size = FileSize(Filename);
  Result_t result = Buffer.Capacity(file_size);

  if ( KM_SUCCESS(result) )
    {
      ui32_t read_count = 0;
      FileReader Reader;

      result = Reader.OpenRead(Filename);

      if ( KM_SUCCESS(result) )
	result = Reader.Read(Buffer.Data(), file_size, &read_count);
    
      if ( KM_SUCCESS(result) )
	{
	  if ( file_size != read_count) 
	    return RESULT_READFAIL;

	  Buffer.Length(read_count);
	}
    }
  
  return result;
}